

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::ChainStateFlushed
          (ValidationSignals *this,ChainstateRole role,CBlockLocator *locator)

{
  undefined1 uVar1;
  bool bVar2;
  pointer pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000030;
  char **in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  char *local_name;
  anon_class_40_3_58e176f4_for_event event;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  char *in_stack_fffffffffffffe90;
  anon_class_40_3_58e176f4_for_event *in_stack_fffffffffffffe98;
  anon_class_72_3_3dd4f537 *in_stack_fffffffffffffea0;
  function<void_()> *in_stack_fffffffffffffea8;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 uVar4;
  LogFlags in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  ConstevalFormatString<2U> in_stack_ffffffffffffff38;
  string_view in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff50;
  undefined1 local_a0 [39];
  allocator<char> local_79 [33];
  char *local_58 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockLocator::CBlockLocator
            ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (CBlockLocator *)0x8503c1);
  local_58[0] = "ChainStateFlushed";
  uVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),Trace);
  if ((bool)uVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
               (char *)in_stack_fffffffffffffea0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea8,
               (char *)in_stack_fffffffffffffea0);
    bVar2 = CBlockLocator::IsNull
                      ((CBlockLocator *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar2) {
      __a = local_79;
      uVar4 = bVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(uVar1,CONCAT16(uVar4,in_stack_fffffffffffffed0)),__a);
    }
    else {
      std::vector<uint256,_std::allocator<uint256>_>::front
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe90);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffe90);
    }
    in_stack_fffffffffffffea0 = (anon_class_72_3_3dd4f537 *)&stack0xffffffffffffffd8;
    in_stack_fffffffffffffe98 = (anon_class_40_3_58e176f4_for_event *)local_58;
    in_stack_fffffffffffffe90 = "Enqueuing %s: block hash=%s\n";
    in_stack_fffffffffffffe88 = 1;
    LogPrintFormatInternal<char_const*,std::__cxx11::string>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef0,in_stack_00000030,in_stack_ffffffffffffff38,
               in_stack_00000040,in_stack_00000048);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar2) {
      std::allocator<char>::~allocator(local_79);
    }
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  pTVar3 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  CBlockLocator::CBlockLocator
            ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (CBlockLocator *)0x8505d1);
  ChainStateFlushed(ChainstateRole,CBlockLocator_const&)::$_1::__1
            (in_stack_fffffffffffffe98,
             (anon_class_40_3_58e176f4_for_event *)in_stack_fffffffffffffe90);
  std::function<void()>::
  function<ValidationSignals::ChainStateFlushed(ChainstateRole,CBlockLocator_const&)::__0,void>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  (*pTVar3->_vptr_TaskRunnerInterface[2])(pTVar3,local_a0);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  ChainStateFlushed(ChainstateRole,CBlockLocator_const&)::$_0::~__0
            ((anon_class_72_3_3dd4f537 *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  ChainStateFlushed(ChainstateRole,CBlockLocator_const&)::$_1::~__1
            ((anon_class_40_3_58e176f4_for_event *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::ChainStateFlushed(ChainstateRole role, const CBlockLocator &locator) {
    auto event = [role, locator, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ChainStateFlushed(role, locator); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s", __func__,
                          locator.IsNull() ? "null" : locator.vHave.front().ToString());
}